

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::createFunctionParametersListNode
          (Parser *this,Token *t,vector<Token_*,_std::allocator<Token_*>_> *params_tokens,
          vector<Node_*,_std::allocator<Node_*>_> *params,
          vector<Node_*,_std::allocator<Node_*>_> *default_values)

{
  pointer ppNVar1;
  Node *this_00;
  Node *this_01;
  long lVar2;
  ulong uVar3;
  Node *param;
  Node *local_48;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  vector<Token_*,_std::allocator<Token_*>_> *local_38;
  
  local_40 = default_values;
  local_38 = params_tokens;
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,this->ctx,t);
  this_00->nodeType = PNT_FUNCTION_PARAMETERS_LIST;
  lVar2 = 0;
  local_48 = this_00;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    this_01 = (Node *)operator_new(0x30);
    Node::Node(this_01,this->ctx,
               *(Token **)
                ((long)(local_38->super__Vector_base<Token_*,_std::allocator<Token_*>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    this_01->nodeType = PNT_FUNCTION_PARAMETER;
    param = this_01;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              (&this_01->children,
               (value_type *)
               ((long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar2));
    ppNVar1 = (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (*(long *)((long)ppNVar1 + lVar2) != 0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                (&param->children,(value_type *)((long)ppNVar1 + lVar2));
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&param);
    lVar2 = lVar2 + 8;
  }
  return local_48;
}

Assistant:

Node * createFunctionParametersListNode(Token & t, vector<Token *> & params_tokens,
    vector<Node *> & params, vector<Node *> & default_values)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION_PARAMETERS_LIST;

    for (size_t i = 0; i < params.size(); i++)
    {
      Node * param = new Node(ctx, *params_tokens[i]);
      param->nodeType = PNT_FUNCTION_PARAMETER;
      param->children.push_back(params[i]);
      if (default_values[i])
        param->children.push_back(default_values[i]);
      n->children.push_back(param);
    }

    return n;
  }